

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall icu_63::TimeZoneFormat::TimeZoneFormat(TimeZoneFormat *this,TimeZoneFormat *other)

{
  UnicodeString *local_48;
  int local_28;
  int32_t i;
  TimeZoneFormat *other_local;
  TimeZoneFormat *this_local;
  
  Format::Format(&this->super_Format,&other->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__TimeZoneFormat_004f9698;
  Locale::Locale(&this->fLocale);
  this->fTimeZoneNames = (TimeZoneNames *)0x0;
  this->fTimeZoneGenericNames = (TimeZoneGenericNames *)0x0;
  UnicodeString::UnicodeString(&this->fGMTPattern);
  local_48 = (UnicodeString *)&this->field_0x280;
  do {
    UnicodeString::UnicodeString(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (UnicodeString *)this->fGMTOffsetDigits);
  UnicodeString::UnicodeString(&this->fGMTZeroFormat);
  UnicodeString::UnicodeString(&this->fGMTPatternPrefix);
  UnicodeString::UnicodeString(&this->fGMTPatternSuffix);
  this->fTZDBTimeZoneNames = (TZDBTimeZoneNames *)0x0;
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    this->fGMTOffsetPatternItems[local_28] = (UVector *)0x0;
  }
  operator=(this,other);
  return;
}

Assistant:

TimeZoneFormat::TimeZoneFormat(const TimeZoneFormat& other)
: Format(other), fTimeZoneNames(NULL), fTimeZoneGenericNames(NULL),
  fTZDBTimeZoneNames(NULL) {

    for (int32_t i = 0; i < UTZFMT_PAT_COUNT; i++) {
        fGMTOffsetPatternItems[i] = NULL;
    }
    *this = other;
}